

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDuration.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  pthread_mutex_t *ppVar2;
  __atomic_base<unsigned_long> _Var3;
  atomic<unsigned_long> aVar4;
  int iVar5;
  size_t sVar6;
  Session *pSVar7;
  undefined8 uVar8;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  long lVar9;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  duration<long,_std::ratio<1L,_1000L>_> *in_R9;
  char *__end;
  long *in_FS_OFFSET;
  timespec ts;
  duration<long,_std::ratio<1L,_1000000000L>_> local_260;
  duration<long,_std::ratio<1L,_1000000L>_> local_258;
  duration<long,_std::ratio<1L,_1000000L>_> local_250;
  undefined1 local_248 [168];
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
    main_cold_1();
    in_RDX = extraout_RDX_01;
  }
  lVar1 = *in_FS_OFFSET;
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
        main_cold_2();
      }
      ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      local_d8._M_p = (pointer)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,"");
      local_78 = 0xf;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{} {} {}","");
      local_258.__r = 1;
      local_260.__r = 2;
      local_250.__r = 3;
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
                ((cx_string<140UL> *)local_248,(detail *)"{} {} {}",(char (*) [9])&local_258,
                 &local_260,&local_250,in_R9);
      local_50._M_p = (pointer)&local_40;
      sVar6 = strlen(local_248);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_248,local_248 + sVar6);
      iVar5 = pthread_mutex_lock(ppVar2);
      if (iVar5 != 0) {
        iVar5 = std::__throw_system_error(iVar5);
        goto LAB_00102d45;
      }
      local_e8._0_8_ = ppVar2[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
      _Var3._M_i = ppVar2[3].__align;
      ppVar2[3].__align = _Var3._M_i + 1;
      pthread_mutex_unlock(ppVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    aVar4.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
      main_cold_3();
    }
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = 0;
    clock_gettime(0,(timespec *)local_248);
    lVar9 = local_248._0_8_ * 1000000000;
    local_248._0_8_ = (pointer)0x1;
    local_258.__r = 2;
    in_R9 = (duration<long,_std::ratio<1L,_1000L>_> *)&local_260;
    local_260.__r = 3;
    binlog::SessionWriter::
    addEvent<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,lVar9 + local_248._8_8_,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)local_248,&local_258,in_R9);
    in_RDX = extraout_RDX;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
    main_cold_4();
    in_RDX = extraout_RDX_02;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
        main_cold_5();
      }
      ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = info;
      local_190._M_p = (pointer)&local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
      local_170._M_p = (pointer)&local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
      local_150._M_p = (pointer)&local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,"");
      local_130 = 0x11;
      local_128._M_p = (pointer)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"{} {} {}","");
      local_258.__r = 4;
      local_260.__r = 5;
      local_250.__r = 6;
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                ((cx_string<154UL> *)local_248,(detail *)"{} {} {}",(char (*) [9])&local_258,
                 (duration<long,_std::ratio<1L,_1L>_> *)&local_260,
                 (duration<long,_std::ratio<60L,_1L>_> *)&local_250,
                 (duration<long,_std::ratio<3600L,_1L>_> *)in_R9);
      local_108._M_p = (pointer)&local_f8;
      sVar6 = strlen(local_248);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,local_248,local_248 + sVar6);
      iVar5 = pthread_mutex_lock(ppVar2);
      if (iVar5 != 0) {
LAB_00102d45:
        uVar8 = std::__throw_system_error(iVar5);
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        _Unwind_Resume(uVar8);
      }
      local_1a0._0_8_ = ppVar2[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
      _Var3._M_i = ppVar2[3].__align;
      ppVar2[3].__align = _Var3._M_i + 1;
      pthread_mutex_unlock(ppVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p != &local_140) {
        operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    aVar4.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_248);
      main_cold_6();
    }
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = 0;
    clock_gettime(0,(timespec *)local_248);
    lVar9 = local_248._0_8_ * 1000000000;
    local_248._0_8_ = (pointer)0x4;
    local_258.__r = 5;
    local_260.__r = 6;
    binlog::SessionWriter::
    addEvent<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,lVar9 + local_248._8_8_,
               (duration<long,_std::ratio<1L,_1L>_> *)local_248,
               (duration<long,_std::ratio<60L,_1L>_> *)&local_258,
               (duration<long,_std::ratio<3600L,_1L>_> *)&local_260);
    in_RDX = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)local_248,(binlog *)&std::cout,in_RDX);
  return 0;
}

Assistant:

int main()
{

  //[duration

  BINLOG_INFO("{} {} {}", std::chrono::nanoseconds{1}, std::chrono::microseconds{2}, std::chrono::milliseconds{3});
  // Outputs: 1ns 2us 3ms
  BINLOG_INFO("{} {} {}", std::chrono::seconds{4}, std::chrono::minutes{5}, std::chrono::hours{6});
  // Outputs: 4s 5m 6h
  //]


  binlog::consume(std::cout);
  return 0;
}